

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

Color kratos::color::hsv_to_rgb(double h,double s,double v)

{
  runtime_error *this;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = h * 6.0;
  if ((uint)(int)dVar1 < 6) {
    dVar5 = (1.0 - s) * v;
    dVar4 = (1.0 - (dVar1 - (double)(int)dVar1) * s) * v;
    dVar6 = (1.0 - (1.0 - (dVar1 - (double)(int)dVar1)) * s) * v;
    dVar2 = dVar5;
    dVar3 = dVar5;
    switch((int)dVar1) {
    case 0:
      dVar3 = dVar6;
      break;
    case 1:
      dVar3 = v;
      v = dVar4;
      break;
    case 2:
      dVar2 = dVar6;
      dVar3 = v;
      v = dVar5;
      break;
    case 3:
      dVar2 = v;
      dVar3 = dVar4;
      v = dVar5;
      break;
    case 4:
      dVar2 = v;
      v = dVar6;
      break;
    case 5:
      dVar2 = dVar4;
    }
    return (Color)((uint3)(int)(v * 255.0) & 0xff |
                  (uint3)(((int)(dVar3 * 255.0) & 0xffU) << 8) |
                  (uint3)((int)(dVar2 * 255.0) << 0x10));
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"HSV H is larger than 1");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Color hsv_to_rgb(double h, double s, double v) {
    auto h_i = static_cast<int>(h * 6);
    auto f = h * 6 - h_i;
    auto p = v * (1 - s);
    auto q = v * (1 - f * s);
    auto t = v * (1 - (1 - f) * s);
    double r_, g_, b_;

    switch (h_i) {
        case 0: {
            r_ = v;
            g_ = t;
            b_ = p;
            break;
        }
        case 1: {
            r_ = q;
            g_ = v;
            b_ = p;
            break;
        }
        case 2: {
            r_ = p;
            g_ = v;
            b_ = t;
            break;
        }
        case 3: {
            r_ = p;
            g_ = q;
            b_ = v;
            break;
        }
        case 4: {
            r_ = t;
            g_ = p;
            b_ = v;
            break;
        }
        case 5: {
            r_ = v;
            g_ = p;
            b_ = q;
            break;
        }
        default:
            throw std::runtime_error("HSV H is larger than 1");
    }
    auto r = static_cast<unsigned char>(r_ * 255);
    auto g = static_cast<unsigned char>(g_ * 255);
    auto b = static_cast<unsigned char>(b_ * 255);
    return {r, g, b};
}